

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_buf.h
# Opt level: O1

void __thiscall io_buf::reset_file(io_buf *this,int f)

{
  char *pcVar1;
  
  lseek64(f,0,0);
  pcVar1 = (this->space)._begin;
  (this->space)._end = pcVar1;
  this->head = pcVar1;
  return;
}

Assistant:

virtual void reset_file(int f)
  {
#ifdef _WIN32
    _lseek(f, 0, SEEK_SET);
#else
    lseek(f, 0, SEEK_SET);
#endif
    space.end() = space.begin();
    head = space.begin();
  }